

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ImplicitTypeSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ImplicitTypeSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_60;
  size_t index_local;
  ImplicitTypeSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->signing).kind;
    token._2_1_ = (this->signing).field_0x2;
    token.numFlags.raw = (this->signing).numFlags.raw;
    token.rawLen = (this->signing).rawLen;
    token.info = (this->signing).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (ImplicitTypeSyntax *)0xffffffffffffffe0) {
      local_60 = &(this->dimensions).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else if (index == 2) {
    token_00.kind = (this->placeholder).kind;
    token_00._2_1_ = (this->placeholder).field_0x2;
    token_00.numFlags.raw = (this->placeholder).numFlags.raw;
    token_00.rawLen = (this->placeholder).rawLen;
    token_00.info = (this->placeholder).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ImplicitTypeSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return signing;
        case 1: return &dimensions;
        case 2: return placeholder;
        default: return nullptr;
    }
}